

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O2

GLHorizonInfo * __thiscall
UniqueList<GLHorizonInfo>::Get(UniqueList<GLHorizonInfo> *this,GLHorizonInfo *t)

{
  uint uVar1;
  GLHorizonInfo **ppGVar2;
  GLHorizonInfo *__s2;
  int iVar3;
  uint i;
  ulong uVar4;
  GLHorizonInfo *newo;
  
  uVar1 = (this->Array).Count;
  ppGVar2 = (this->Array).Array;
  uVar4 = 0;
  do {
    if (uVar1 == uVar4) {
      newo = (GLHorizonInfo *)operator_new(0x60);
      GLHorizonInfo::operator=(newo,t);
      TArray<GLHorizonInfo_*,_GLHorizonInfo_*>::Push(&this->Array,&newo);
      return newo;
    }
    __s2 = ppGVar2[uVar4];
    iVar3 = bcmp(t,__s2,0x60);
    uVar4 = uVar4 + 1;
  } while (iVar3 != 0);
  return __s2;
}

Assistant:

T * Get(T * t)
	{
		for(unsigned i=0;i<Array.Size();i++)
		{
			if (!memcmp(t, Array[i], sizeof(T))) return Array[i];
		}
		T * newo=TheFreeList.GetNew();

		*newo=*t;
		Array.Push(newo);
		return newo;
	}